

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntSetEntry(Vec_Int_t *p,int i,int Entry)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  if (i < p->nSize) goto LAB_004bc088;
  iVar1 = i + 1;
  iVar2 = p->nCap;
  iVar4 = iVar2 * 2;
  if (i < iVar4) {
    if (iVar2 < iVar4 && iVar2 <= i) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((long)iVar2 << 3);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,(long)iVar2 << 3);
      }
      p->pArray = piVar3;
LAB_004bc054:
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = iVar4;
    }
  }
  else if (iVar2 <= i) {
    if (p->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(p->pArray,(long)iVar1 << 2);
    }
    p->pArray = piVar3;
    iVar4 = iVar1;
    goto LAB_004bc054;
  }
  iVar2 = p->nSize;
  if (iVar2 <= i) {
    memset(p->pArray + iVar2,0,(ulong)(uint)(i - iVar2) * 4 + 4);
  }
  p->nSize = iVar1;
LAB_004bc088:
  if ((-1 < i) && (i < p->nSize)) {
    p->pArray[(uint)i] = Entry;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void Vec_IntSetEntry( Vec_Int_t * p, int i, int Entry )
{
    Vec_IntFillExtra( p, i + 1, 0 );
    Vec_IntWriteEntry( p, i, Entry );
}